

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int check_7zip_header_in_sfx(char *p)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  
  cVar1 = p[5];
  if (cVar1 == -0x44) {
    iVar2 = 3;
  }
  else if (cVar1 == '\'') {
    iVar2 = 1;
  }
  else if (cVar1 == '7') {
    iVar2 = 5;
  }
  else if (cVar1 == 'z') {
    iVar2 = 4;
  }
  else if (cVar1 == -0x51) {
    iVar2 = 2;
  }
  else {
    if (cVar1 == '\x1c') {
      iVar2 = bcmp(p,anon_var_dwarf_4e169,6);
      if (iVar2 == 0) {
        uVar3 = crc32(0,p + 0xc,0x14);
        iVar2 = 6;
        if (uVar3 == *(uint *)(p + 8)) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = 6;
      }
      return iVar2;
    }
    iVar2 = 6;
  }
  return iVar2;
}

Assistant:

static int
check_7zip_header_in_sfx(const char *p)
{
	switch ((unsigned char)p[5]) {
	case 0x1C:
		if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0)
			return (6);
		/*
		 * Test the CRC because its extraction code has 7-Zip
		 * Magic Code, so we should do this in order not to
		 * make a mis-detection.
		 */
		if (crc32(0, (const unsigned char *)p + 12, 20)
			!= archive_le32dec(p + 8))
			return (6);
		/* Hit the header! */
		return (0);
	case 0x37: return (5);
	case 0x7A: return (4);
	case 0xBC: return (3);
	case 0xAF: return (2);
	case 0x27: return (1);
	default: return (6);
	}
}